

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FloorPlanGraph.hpp
# Opt level: O2

void __thiscall
graphProperties::serialize<boost::archive::binary_oarchive>
          (graphProperties *this,binary_oarchive *ar,uint version)

{
  boost::archive::save_access::save_primitive<boost::archive::binary_oarchive,std::__cxx11::string>
            (ar,&this->floorname);
  boost::archive::save_access::save_primitive<boost::archive::binary_oarchive,std::__cxx11::string>
            (ar,&this->filepath);
  boost::archive::save_access::save_primitive<boost::archive::binary_oarchive,double>
            (ar,&this->maxx);
  boost::archive::save_access::save_primitive<boost::archive::binary_oarchive,double>
            (ar,&this->maxy);
  boost::archive::save_access::save_primitive<boost::archive::binary_oarchive,double>
            (ar,&this->minx);
  boost::archive::save_access::save_primitive<boost::archive::binary_oarchive,double>
            (ar,&this->minx);
  boost::archive::detail::save_non_pointer_type<boost::archive::binary_oarchive>::save_standard::
  invoke<Point2D>(ar,&this->centroid);
  return;
}

Assistant:

void serialize(Archive &ar, const unsigned int version)
        {

            ar & floorname;
            ar & filepath;
            ar & maxx;
            ar & maxy;
            ar & minx;
            ar & minx;
            ar & centroid;
        }